

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O0

void __thiscall
CTB<UFPC>::PerformLabelingMem
          (CTB<UFPC> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int iVar1;
  int iVar2;
  Mat1b *pMVar3;
  uint uVar4;
  uchar *puVar5;
  int *piVar6;
  uint *puVar7;
  reference pvVar8;
  double dVar9;
  Mat_<int> local_2c8;
  allocator<unsigned_long> local_261;
  value_type_conflict2 local_260;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_258;
  int local_240;
  int local_23c;
  int c_i;
  int r_i;
  int c;
  int prev_state;
  int prob_fol_state;
  int r;
  int h;
  int w;
  undefined1 local_218 [8];
  MemMat<int> img_labels;
  Mat_<unsigned_char> local_140;
  undefined1 local_e0 [8];
  MemMat<unsigned_char> img;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses_local;
  CTB<UFPC> *this_local;
  
  img.accesses_._88_8_ = accesses;
  cv::Mat_<unsigned_char>::Mat_(&local_140,(this->super_Labeling2D<(Connectivity2D)8,_false>).img_);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_e0,&local_140);
  cv::Mat_<unsigned_char>::~Mat_(&local_140);
  cv::MatSize::operator()((MatSize *)&h);
  MemMat<int>::MemMat((MemMat<int> *)local_218,(Size *)&h,0);
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar1 = *(int *)&pMVar3->field_0x8;
  iVar2 = *(int *)&pMVar3->field_0xc;
  UFPC::MemAlloc(((iVar1 + 1) - (iVar1 + 1 >> 0x1f) >> 1) * ((iVar2 + 1) - (iVar2 + 1 >> 0x1f) >> 1)
                 + 1);
  UFPC::MemSetup();
  r = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  prob_fol_state = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  for (prev_state = 0; prev_state < prob_fol_state; prev_state = prev_state + 2) {
    c = -1;
    r_i = -1;
    for (c_i = 0; c_i < r; c_i = c_i + 1) {
      switch(r_i) {
      case 1:
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,prev_state,c_i)
        ;
        if (*puVar5 == '\0') {
          if ((prev_state + 1 < prob_fol_state) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + 1,c_i),
             *puVar5 != '\0')) {
            uVar4 = UFPC::MemNewLabel();
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i);
            *puVar7 = uVar4;
            r_i = 3;
          }
        }
        else {
          r_i = 2;
          if ((prev_state + -1 < 0) ||
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i),
             *puVar5 == '\0')) {
            if ((prev_state + -1 < 0) ||
               ((r <= c_i + 1 ||
                (puVar5 = MemMat<unsigned_char>::operator()
                                    ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i + 1),
                *puVar5 == '\0')))) {
              c = 6;
              if ((c_i + -1 < 0) ||
                 ((prev_state + -1 < 0 ||
                  (puVar5 = MemMat<unsigned_char>::operator()
                                      ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i + -1),
                  *puVar5 == '\0')))) {
                uVar4 = UFPC::MemNewLabel();
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
                *puVar7 = uVar4;
              }
              else {
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + -1,c_i + -1);
                iVar1 = *piVar6;
                piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
                *piVar6 = iVar1;
              }
            }
            else {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + -1,c_i + 1);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
              *piVar6 = iVar1;
              c = 5;
              if (((-1 < c_i + -1) && (-1 < prev_state + -1)) &&
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i + -1),
                 *puVar5 != '\0')) {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()
                                           ((MemMat<int> *)local_218,prev_state + -1,c_i + -1);
                UFPC::MemMerge(uVar4,*puVar7);
              }
            }
          }
          else {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + -1,c_i);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            *piVar6 = iVar1;
            c = 4;
          }
          if ((prev_state + 1 < prob_fol_state) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + 1,c_i),
             *puVar5 != '\0')) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i);
            *piVar6 = iVar1;
          }
        }
        break;
      case 2:
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,prev_state,c_i)
        ;
        if (*puVar5 == '\0') {
          if ((prev_state + 1 < prob_fol_state) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + 1,c_i),
             *puVar5 != '\0')) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i + -1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i);
            *piVar6 = iVar1;
            r_i = 7;
          }
          else {
            r_i = 1;
          }
        }
        else {
          if (c == 4) {
            r_i = 4;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i + -1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            *piVar6 = iVar1;
            if ((prev_state + -1 < 0) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i),
               *puVar5 == '\0')) {
              if ((prev_state + -1 < 0) ||
                 ((r <= c_i + 1 ||
                  (puVar5 = MemMat<unsigned_char>::operator()
                                      ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i + 1),
                  *puVar5 == '\0')))) {
                c = 6;
              }
              else {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()
                                           ((MemMat<int> *)local_218,prev_state + -1,c_i + 1);
                UFPC::MemMerge(uVar4,*puVar7);
                c = 5;
              }
            }
            else {
              c = 4;
            }
          }
          else if (c == 5) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i + -1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            *piVar6 = iVar1;
            r_i = 5;
          }
          else if (c == 6) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i + -1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            *piVar6 = iVar1;
            if (((prev_state + -1 < 0) || (r <= c_i + 1)) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i + 1),
               *puVar5 == '\0')) {
              c = 6;
            }
            else {
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
              uVar4 = *puVar7;
              puVar7 = (uint *)MemMat<int>::operator()
                                         ((MemMat<int> *)local_218,prev_state + -1,c_i + 1);
              UFPC::MemMerge(uVar4,*puVar7);
              c = 5;
            }
          }
          if ((prev_state + 1 < prob_fol_state) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + 1,c_i),
             *puVar5 != '\0')) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i);
            *piVar6 = iVar1;
          }
        }
        break;
      case 3:
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,prev_state,c_i)
        ;
        if (*puVar5 == '\0') {
          if ((prev_state + 1 < prob_fol_state) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + 1,c_i),
             *puVar5 != '\0')) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i + -1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i);
            *piVar6 = iVar1;
            r_i = 9;
          }
          else {
            r_i = 1;
          }
        }
        else {
          r_i = 8;
          if ((prev_state + -1 < 0) ||
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i),
             *puVar5 == '\0')) {
            if ((prev_state + -1 < 0) ||
               ((r <= c_i + 1 ||
                (puVar5 = MemMat<unsigned_char>::operator()
                                    ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i + 1),
                *puVar5 == '\0')))) {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i + -1);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
              *piVar6 = iVar1;
              if ((-1 < c_i + -1) &&
                 ((-1 < prev_state + -1 &&
                  (puVar5 = MemMat<unsigned_char>::operator()
                                      ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i + -1),
                  *puVar5 != '\0')))) {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()
                                           ((MemMat<int> *)local_218,prev_state + -1,c_i + -1);
                UFPC::MemMerge(uVar4,*puVar7);
              }
              c = 6;
            }
            else {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + -1,c_i + 1);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
              *piVar6 = iVar1;
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
              uVar4 = *puVar7;
              puVar7 = (uint *)MemMat<int>::operator()
                                         ((MemMat<int> *)local_218,prev_state + 1,c_i + -1);
              UFPC::MemMerge(uVar4,*puVar7);
              if (((-1 < c_i + -1) && (-1 < prev_state + -1)) &&
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i + -1),
                 *puVar5 != '\0')) {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()
                                           ((MemMat<int> *)local_218,prev_state + -1,c_i + -1);
                UFPC::MemMerge(uVar4,*puVar7);
              }
              c = 5;
            }
          }
          else {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + -1,c_i);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            *piVar6 = iVar1;
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            uVar4 = *puVar7;
            puVar7 = (uint *)MemMat<int>::operator()
                                       ((MemMat<int> *)local_218,prev_state + 1,c_i + -1);
            UFPC::MemMerge(uVar4,*puVar7);
            c = 4;
          }
          if ((prev_state + 1 < prob_fol_state) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + 1,c_i),
             *puVar5 != '\0')) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i);
            *piVar6 = iVar1;
          }
        }
        break;
      case 4:
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,prev_state,c_i)
        ;
        if (*puVar5 == '\0') {
          if ((prev_state + 1 < prob_fol_state) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + 1,c_i),
             *puVar5 != '\0')) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i + -1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i);
            *piVar6 = iVar1;
            r_i = 7;
          }
          else {
            r_i = 1;
          }
        }
        else {
          if (c == 4) {
            r_i = 4;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i + -1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            *piVar6 = iVar1;
            if ((prev_state + -1 < 0) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i),
               *puVar5 == '\0')) {
              if ((prev_state + -1 < 0) ||
                 ((r <= c_i + 1 ||
                  (puVar5 = MemMat<unsigned_char>::operator()
                                      ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i + 1),
                  *puVar5 == '\0')))) {
                c = 6;
              }
              else {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()
                                           ((MemMat<int> *)local_218,prev_state + -1,c_i + 1);
                UFPC::MemMerge(uVar4,*puVar7);
                c = 5;
              }
            }
            else {
              c = 4;
            }
          }
          else if (c == 5) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i + -1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            *piVar6 = iVar1;
            r_i = 5;
          }
          else if (c == 6) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i + -1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            *piVar6 = iVar1;
            if (((prev_state + -1 < 0) || (r <= c_i + 1)) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i + 1),
               *puVar5 == '\0')) {
              c = 6;
            }
            else {
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
              uVar4 = *puVar7;
              puVar7 = (uint *)MemMat<int>::operator()
                                         ((MemMat<int> *)local_218,prev_state + -1,c_i + 1);
              UFPC::MemMerge(uVar4,*puVar7);
              c = 5;
            }
          }
          if ((prev_state + 1 < prob_fol_state) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + 1,c_i),
             *puVar5 != '\0')) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i);
            *piVar6 = iVar1;
          }
        }
        break;
      case 5:
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,prev_state,c_i)
        ;
        if (*puVar5 == '\0') {
          if ((prev_state + 1 < prob_fol_state) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + 1,c_i),
             *puVar5 != '\0')) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i + -1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i);
            *piVar6 = iVar1;
            r_i = 7;
          }
          else {
            r_i = 1;
          }
        }
        else {
          r_i = 4;
          piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i + -1);
          iVar1 = *piVar6;
          piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
          *piVar6 = iVar1;
          if ((prev_state + -1 < 0) ||
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i),
             *puVar5 == '\0')) {
            if ((prev_state + -1 < 0) ||
               ((r <= c_i + 1 ||
                (puVar5 = MemMat<unsigned_char>::operator()
                                    ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i + 1),
                *puVar5 == '\0')))) {
              c = 6;
            }
            else {
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
              uVar4 = *puVar7;
              puVar7 = (uint *)MemMat<int>::operator()
                                         ((MemMat<int> *)local_218,prev_state + -1,c_i + 1);
              UFPC::MemMerge(uVar4,*puVar7);
              c = 5;
            }
          }
          else {
            c = 4;
          }
          if ((prev_state + 1 < prob_fol_state) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + 1,c_i),
             *puVar5 != '\0')) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i);
            *piVar6 = iVar1;
          }
        }
        break;
      case 6:
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,prev_state,c_i)
        ;
        if (*puVar5 == '\0') {
          if ((prev_state + 1 < prob_fol_state) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + 1,c_i),
             *puVar5 != '\0')) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i + -1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i);
            *piVar6 = iVar1;
            r_i = 7;
          }
          else {
            r_i = 1;
          }
        }
        else {
          if (c == 5) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i + -1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            *piVar6 = iVar1;
            r_i = 5;
          }
          else if (c == 6) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i + -1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            *piVar6 = iVar1;
            if (((prev_state + -1 < 0) || (r <= c_i + 1)) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i + 1),
               *puVar5 == '\0')) {
              c = 6;
            }
            else {
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
              uVar4 = *puVar7;
              puVar7 = (uint *)MemMat<int>::operator()
                                         ((MemMat<int> *)local_218,prev_state + -1,c_i + 1);
              UFPC::MemMerge(uVar4,*puVar7);
              c = 5;
            }
          }
          if ((prev_state + 1 < prob_fol_state) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + 1,c_i),
             *puVar5 != '\0')) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i);
            *piVar6 = iVar1;
          }
        }
        break;
      case 7:
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,prev_state,c_i)
        ;
        if (*puVar5 == '\0') {
          if ((prev_state + 1 < prob_fol_state) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + 1,c_i),
             *puVar5 != '\0')) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i + -1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i);
            *piVar6 = iVar1;
            r_i = 9;
          }
          else {
            r_i = 1;
          }
        }
        else {
          r_i = 8;
          if ((prev_state + -1 < 0) ||
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i),
             *puVar5 == '\0')) {
            if ((prev_state + -1 < 0) ||
               ((r <= c_i + 1 ||
                (puVar5 = MemMat<unsigned_char>::operator()
                                    ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i + 1),
                *puVar5 == '\0')))) {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i + -1);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
              *piVar6 = iVar1;
              if ((-1 < c_i + -1) &&
                 ((-1 < prev_state + -1 &&
                  (puVar5 = MemMat<unsigned_char>::operator()
                                      ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i + -1),
                  *puVar5 != '\0')))) {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()
                                           ((MemMat<int> *)local_218,prev_state + -1,c_i + -1);
                UFPC::MemMerge(uVar4,*puVar7);
              }
              c = 6;
            }
            else {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + -1,c_i + 1);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
              *piVar6 = iVar1;
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
              uVar4 = *puVar7;
              puVar7 = (uint *)MemMat<int>::operator()
                                         ((MemMat<int> *)local_218,prev_state + 1,c_i + -1);
              UFPC::MemMerge(uVar4,*puVar7);
              if (((-1 < c_i + -1) && (-1 < prev_state + -1)) &&
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i + -1),
                 *puVar5 != '\0')) {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()
                                           ((MemMat<int> *)local_218,prev_state + -1,c_i + -1);
                UFPC::MemMerge(uVar4,*puVar7);
              }
              c = 5;
            }
          }
          else {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + -1,c_i);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            *piVar6 = iVar1;
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            uVar4 = *puVar7;
            puVar7 = (uint *)MemMat<int>::operator()
                                       ((MemMat<int> *)local_218,prev_state + 1,c_i + -1);
            UFPC::MemMerge(uVar4,*puVar7);
            c = 4;
          }
          if ((prev_state + 1 < prob_fol_state) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + 1,c_i),
             *puVar5 != '\0')) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i);
            *piVar6 = iVar1;
          }
        }
        break;
      case 8:
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,prev_state,c_i)
        ;
        if (*puVar5 == '\0') {
          if ((prev_state + 1 < prob_fol_state) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + 1,c_i),
             *puVar5 != '\0')) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i + -1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i);
            *piVar6 = iVar1;
            r_i = 7;
          }
          else {
            r_i = 1;
          }
        }
        else {
          if (c == 4) {
            r_i = 4;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i + -1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            *piVar6 = iVar1;
            if ((prev_state + -1 < 0) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i),
               *puVar5 == '\0')) {
              if ((prev_state + -1 < 0) ||
                 ((r <= c_i + 1 ||
                  (puVar5 = MemMat<unsigned_char>::operator()
                                      ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i + 1),
                  *puVar5 == '\0')))) {
                c = 6;
              }
              else {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()
                                           ((MemMat<int> *)local_218,prev_state + -1,c_i + 1);
                UFPC::MemMerge(uVar4,*puVar7);
                c = 5;
              }
            }
            else {
              c = 4;
            }
          }
          else if (c == 5) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i + -1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            *piVar6 = iVar1;
            r_i = 5;
          }
          else if (c == 6) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i + -1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            *piVar6 = iVar1;
            if (((prev_state + -1 < 0) || (r <= c_i + 1)) ||
               (puVar5 = MemMat<unsigned_char>::operator()
                                   ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i + 1),
               *puVar5 == '\0')) {
              c = 6;
            }
            else {
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
              uVar4 = *puVar7;
              puVar7 = (uint *)MemMat<int>::operator()
                                         ((MemMat<int> *)local_218,prev_state + -1,c_i + 1);
              UFPC::MemMerge(uVar4,*puVar7);
              c = 5;
            }
          }
          if ((prev_state + 1 < prob_fol_state) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + 1,c_i),
             *puVar5 != '\0')) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i);
            *piVar6 = iVar1;
          }
        }
        break;
      case 9:
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,prev_state,c_i)
        ;
        if (*puVar5 == '\0') {
          if ((prev_state + 1 < prob_fol_state) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + 1,c_i),
             *puVar5 != '\0')) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i + -1);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i);
            *piVar6 = iVar1;
            r_i = 9;
          }
          else {
            r_i = 1;
          }
        }
        else {
          r_i = 8;
          if ((prev_state + -1 < 0) ||
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i),
             *puVar5 == '\0')) {
            if ((prev_state + -1 < 0) ||
               ((r <= c_i + 1 ||
                (puVar5 = MemMat<unsigned_char>::operator()
                                    ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i + 1),
                *puVar5 == '\0')))) {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i + -1);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
              *piVar6 = iVar1;
              if ((-1 < c_i + -1) &&
                 ((-1 < prev_state + -1 &&
                  (puVar5 = MemMat<unsigned_char>::operator()
                                      ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i + -1),
                  *puVar5 != '\0')))) {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()
                                           ((MemMat<int> *)local_218,prev_state + -1,c_i + -1);
                UFPC::MemMerge(uVar4,*puVar7);
              }
              c = 6;
            }
            else {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + -1,c_i + 1);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
              *piVar6 = iVar1;
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
              uVar4 = *puVar7;
              puVar7 = (uint *)MemMat<int>::operator()
                                         ((MemMat<int> *)local_218,prev_state + 1,c_i + -1);
              UFPC::MemMerge(uVar4,*puVar7);
              if (((-1 < c_i + -1) && (-1 < prev_state + -1)) &&
                 (puVar5 = MemMat<unsigned_char>::operator()
                                     ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i + -1),
                 *puVar5 != '\0')) {
                puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
                uVar4 = *puVar7;
                puVar7 = (uint *)MemMat<int>::operator()
                                           ((MemMat<int> *)local_218,prev_state + -1,c_i + -1);
                UFPC::MemMerge(uVar4,*puVar7);
              }
              c = 5;
            }
          }
          else {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + -1,c_i);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            *piVar6 = iVar1;
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            uVar4 = *puVar7;
            puVar7 = (uint *)MemMat<int>::operator()
                                       ((MemMat<int> *)local_218,prev_state + 1,c_i + -1);
            UFPC::MemMerge(uVar4,*puVar7);
            c = 4;
          }
          if ((prev_state + 1 < prob_fol_state) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + 1,c_i),
             *puVar5 != '\0')) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i);
            *piVar6 = iVar1;
          }
        }
        break;
      case -1:
        puVar5 = MemMat<unsigned_char>::operator()((MemMat<unsigned_char> *)local_e0,prev_state,c_i)
        ;
        if (*puVar5 == '\0') {
          if ((prev_state + 1 < prob_fol_state) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + 1,c_i),
             *puVar5 != '\0')) {
            uVar4 = UFPC::MemNewLabel();
            puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i);
            *puVar7 = uVar4;
            r_i = 7;
          }
          else {
            r_i = 1;
          }
        }
        else {
          r_i = 2;
          if ((prev_state + -1 < 0) ||
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i),
             *puVar5 == '\0')) {
            if ((prev_state + -1 < 0) ||
               ((r <= c_i + 1 ||
                (puVar5 = MemMat<unsigned_char>::operator()
                                    ((MemMat<unsigned_char> *)local_e0,prev_state + -1,c_i + 1),
                *puVar5 == '\0')))) {
              uVar4 = UFPC::MemNewLabel();
              puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
              *puVar7 = uVar4;
              c = 6;
            }
            else {
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + -1,c_i + 1);
              iVar1 = *piVar6;
              piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
              *piVar6 = iVar1;
              c = 5;
            }
          }
          else {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + -1,c_i);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            *piVar6 = iVar1;
            c = 4;
          }
          if ((prev_state + 1 < prob_fol_state) &&
             (puVar5 = MemMat<unsigned_char>::operator()
                                 ((MemMat<unsigned_char> *)local_e0,prev_state + 1,c_i),
             *puVar5 != '\0')) {
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state,c_i);
            iVar1 = *piVar6;
            piVar6 = MemMat<int>::operator()((MemMat<int> *)local_218,prev_state + 1,c_i);
            *piVar6 = iVar1;
          }
        }
      }
    }
  }
  uVar4 = UFPC::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar4;
  for (local_23c = 0; local_23c < (int)local_218._0_4_; local_23c = local_23c + 1) {
    for (local_240 = 0; local_240 < (int)local_218._4_4_; local_240 = local_240 + 1) {
      puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,local_23c,local_240);
      uVar4 = UFPC::MemGetLabel(*puVar7);
      puVar7 = (uint *)MemMat<int>::operator()((MemMat<int> *)local_218,local_23c,local_240);
      *puVar7 = uVar4;
    }
  }
  local_260 = 0;
  std::allocator<unsigned_long>::allocator(&local_261);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_258,4,&local_260,&local_261);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)img.accesses_._88_8_,
             &local_258);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_258);
  std::allocator<unsigned_long>::~allocator(&local_261);
  dVar9 = MemMat<unsigned_char>::GetTotalAccesses((MemMat<unsigned_char> *)local_e0);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)img.accesses_._88_8_,
                      0);
  *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
  dVar9 = MemMat<int>::GetTotalAccesses((MemMat<int> *)local_218);
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)img.accesses_._88_8_,
                      1);
  *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
  dVar9 = UFPC::MemTotalAccesses();
  pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)img.accesses_._88_8_,
                      2);
  *pvVar8 = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
  MemMat<int>::GetImage(&local_2c8,(MemMat<int> *)local_218);
  cv::Mat_<int>::operator=
            ((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_2c8);
  cv::Mat_<int>::~Mat_(&local_2c8);
  UFPC::MemDealloc();
  MemMat<int>::~MemMat((MemMat<int> *)local_218);
  MemMat<unsigned_char>::~MemMat((MemMat<unsigned_char> *)local_e0);
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        // Scan Mask
        // +--+--+--+
        // |n1|n2|n3|
        // +--+--+--+
        // |n4|a |
        // +--+--+
        // |n5|b |
        // +--+--+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        for (int r = 0; r < h; r += 2) {

            int prob_fol_state = BR;
            int prev_state = BR;

            for (int c = 0; c < w; c += 1) {

                // A bunch of defines used to check if the pixels are foreground, and current state of graph
                // without going outside the image limits.

#define CONDITION_A img(r,c)>0
#define CONDITION_B r+1<h && img(r + 1, c)>0
#define CONDITION_N1 c-1>=0 && r-1>=0 && img(r - 1, c - 1)>0
#define CONDITION_N2 r-1>=0 && img(r - 1, c)>0
#define CONDITION_N3 r-1>=0 && c+1<w && img(r - 1, c + 1)>0
#define CONDITION_N4 c-1>=0 && img(r, c - 1)>0
#define CONDITION_N5 c-1>=0 && r+1<h && img(r + 1, c - 1)>0

#define ACTION_1 // nothing
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); // new label
#define ACTION_3 img_labels(r, c) = img_labels(r - 1, c - 1); // a <- n1
#define ACTION_4 img_labels(r, c) = img_labels(r - 1, c); // a <- n2
#define ACTION_5 img_labels(r, c) = img_labels(r - 1, c + 1); // a <- n3
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 1); // a <- n4
#define ACTION_7 img_labels(r, c) = img_labels(r + 1, c - 1); // a <- n5
#define ACTION_8 LabelsSolver::MemMerge(img_labels(r,c), img_labels(r - 1, c - 1)); // a + n1
#define ACTION_9 LabelsSolver::MemMerge(img_labels(r,c), img_labels(r - 1, c + 1)); // a + n3
#define ACTION_10 LabelsSolver::MemMerge(img_labels(r,c), img_labels(r + 1, c - 1)); // a + n5
#define ACTION_11 img_labels(r + 1, c) = LabelsSolver::MemNewLabel(); // b new label
#define ACTION_12 img_labels(r + 1, c) = img_labels(r, c - 1); // b <- n4
#define ACTION_13 img_labels(r + 1, c) = img_labels(r + 1, c - 1); // b <- n5
#define ACTION_14 img_labels(r + 1, c) = img_labels(r, c); // b <- a

#include "labeling_he_2014_graph.inc.h"
            }//End columns's for
        }//End rows's for

#undef ACTION_1 
#undef ACTION_2 
#undef ACTION_3 
#undef ACTION_4 
#undef ACTION_5 
#undef ACTION_6 
#undef ACTION_7 
#undef ACTION_8 
#undef ACTION_9 
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14

#undef CONDITION_A 
#undef CONDITION_B 
#undef CONDITION_N1
#undef CONDITION_N2
#undef CONDITION_N3
#undef CONDITION_N4
#undef CONDITION_N5

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels.rows; ++r_i) {
            for (int c_i = 0; c_i < img_labels.cols; ++c_i) {
                img_labels(r_i,c_i) = LabelsSolver::MemGetLabel(img_labels(r_i, c_i));
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();
    }